

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::clear(HEkk *this)

{
  clearEkkLp(this);
  clearEkkDualize(this);
  clearEkkData(this);
  clearEkkDualEdgeWeightData(this);
  this->callback_ = (HighsCallback *)0x0;
  this->options_ = (HighsOptions *)0x0;
  this->timer_ = (HighsTimer *)0x0;
  SimplexBasis::clear(&this->basis_);
  HSimplexNla::clear(&this->simplex_nla_);
  (this->status_).initialised_for_new_lp = false;
  (this->status_).initialised_for_solve = false;
  (this->status_).has_basis = false;
  (this->status_).has_ar_matrix = false;
  (this->status_).has_nla = false;
  (this->status_).has_dual_steepest_edge_weights = false;
  (this->status_).has_invert = false;
  (this->status_).has_fresh_invert = false;
  (this->status_).has_fresh_rebuild = false;
  (this->status_).has_dual_objective_value = false;
  (this->status_).has_primal_objective_value = false;
  clearRayRecords(this);
  return;
}

Assistant:

void HEkk::clear() {
  // Clears Ekk entirely. Clears all associated pointers, data scalars
  // and vectors, and the status values.
  this->clearEkkLp();
  this->clearEkkDualize();
  this->clearEkkData();
  this->clearEkkDualEdgeWeightData();
  this->clearEkkPointers();
  this->basis_.clear();
  this->simplex_nla_.clear();
  this->clearEkkAllStatus();
  this->clearRayRecords();
}